

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O3

cmMakefile * __thiscall
cmakels::cmake_query::cmake_query::get_makefile(cmake_query *this,string *uri)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  ulong uVar6;
  int iVar7;
  ulong __n;
  cmMakefile *pcVar8;
  pointer ppcVar9;
  bool bVar10;
  string filename;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> mfs;
  string local_90;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_50;
  pointer local_38;
  
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            (&local_50,
             &((this->my_cmake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
               super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->GlobalGenerator->Makefiles);
  support::uri_to_filename(&local_90,uri);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_38 = local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppcVar9 = local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar8 = *ppcVar9;
      pbVar2 = (pcVar8->ListFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (pbVar2->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + pbVar2->_M_string_length);
      uVar6 = local_68;
      sVar5 = local_90._M_string_length;
      _Var4._M_p = local_90._M_dataplus._M_p;
      __n = local_90._M_string_length;
      if (local_68 < local_90._M_string_length) {
        __n = local_68;
      }
      if (__n == 0) {
LAB_0013e190:
        bVar10 = sVar5 == uVar6;
      }
      else {
        iVar7 = bcmp(local_90._M_dataplus._M_p,local_70,__n);
        if (iVar7 == 0) goto LAB_0013e190;
        bVar10 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != paVar1) {
        operator_delete(_Var4._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (bVar10) goto LAB_0013e1c5;
      ppcVar9 = ppcVar9 + 1;
    } while (ppcVar9 != local_38);
  }
  pcVar8 = (cmMakefile *)0x0;
LAB_0013e1c5:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pcVar8;
}

Assistant:

cmMakefile *cmake_query::get_makefile(std::string const &uri) {
  auto mfs = my_cmake->GetGlobalGenerator()->GetMakefiles();
  auto filename = normalize_filename(support::uri_to_filename(uri));
  for (auto mf : mfs) {
    if (normalize_filename(mf->GetListFiles()[0]).compare(filename) == 0) {
      return mf;
    }
  }
  return nullptr;
}